

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

cs_m68k * build_init_op(m68k_info *info,int opcode,int count,int size)

{
  undefined4 in_ECX;
  undefined1 in_DL;
  uint in_ESI;
  long in_RDI;
  cs_m68k *ext;
  
  MCInst_setOpcode(*(MCInst **)(in_RDI + 0x18),in_ESI);
  *(undefined1 *)(in_RDI + 0x118) = in_DL;
  *(undefined4 *)(in_RDI + 0x110) = 1;
  *(undefined4 *)(in_RDI + 0x114) = in_ECX;
  return (cs_m68k *)(in_RDI + 0x30);
}

Assistant:

static cs_m68k* build_init_op(m68k_info *info, int opcode, int count, int size)
{
	cs_m68k* ext;

	MCInst_setOpcode(info->inst, opcode);

	ext = &info->extension;

	ext->op_count = (uint8_t)count;
	ext->op_size.type = M68K_SIZE_TYPE_CPU;
	ext->op_size.cpu_size = size;

	return ext;
}